

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O0

void __thiscall
camp::UserObject::UserObject(UserObject *this,UserObject *parent,UserProperty *member)

{
  Class *pCVar1;
  ParentObject *pPVar2;
  UserProperty *member_local;
  UserObject *parent_local;
  UserObject *this_local;
  
  pCVar1 = UserProperty::getClass(member);
  this->m_class = pCVar1;
  std::shared_ptr<camp::detail::AbstractObjectHolder>::shared_ptr(&this->m_holder);
  pPVar2 = (ParentObject *)operator_new(0x58);
  ParentObject::ParentObject(pPVar2,parent,member);
  boost::scoped_ptr<camp::ParentObject>::scoped_ptr(&this->m_parent,pPVar2);
  this->m_child = (UserObject *)0x0;
  pPVar2 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
  (pPVar2->object).m_child = this;
  return;
}

Assistant:

UserObject::UserObject(const UserObject& parent, const UserProperty& member)
    : m_class(&member.getClass())
    , m_holder()
    , m_parent(new ParentObject(parent, member))
    , m_child(0)
{
    m_parent->object.m_child = this;
}